

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
* __thiscall
spvtools::opt::LoopDependenceAnalysis::CollectLoops
          (set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDependenceAnalysis *this,SENode *source,SENode *destination)

{
  _Rb_tree_header *p_Var1;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_nodes;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  destination_loops;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_80;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_68;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_50;
  
  if (source == (SENode *)0x0 || destination == (SENode *)0x0) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    SENode::CollectRecurrentNodes(&local_80,source);
    SENode::CollectRecurrentNodes(&local_68,destination);
    CollectLoops(__return_storage_ptr__,(LoopDependenceAnalysis *)destination,&local_80);
    CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)&local_50,(LoopDependenceAnalysis *)destination,&local_68);
    std::
    _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::opt::Loop_const*>>
              ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>)
               local_50._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>)
               &local_50._M_impl.super__Rb_tree_header);
    std::
    _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
    ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (local_68.
        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.
        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const Loop*> LoopDependenceAnalysis::CollectLoops(
    SENode* source, SENode* destination) {
  if (!source || !destination) {
    return std::set<const Loop*>{};
  }

  std::vector<SERecurrentNode*> source_nodes = source->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_nodes =
      destination->CollectRecurrentNodes();

  std::set<const Loop*> loops = CollectLoops(source_nodes);
  std::set<const Loop*> destination_loops = CollectLoops(destination_nodes);

  loops.insert(std::begin(destination_loops), std::end(destination_loops));

  return loops;
}